

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O2

void __thiscall QtMWidgets::ScrollArea::ScrollArea(ScrollArea *this,QWidget *parent)

{
  ScrollAreaPrivate *this_00;
  
  *(undefined ***)&this->super_AbstractScrollArea = &PTR_metaObject_001bba00;
  *(undefined ***)&(this->super_AbstractScrollArea).field_0x10 = &PTR__ScrollArea_001bbbc8;
  this_00 = (ScrollAreaPrivate *)operator_new(0xc0);
  ScrollAreaPrivate::ScrollAreaPrivate(this_00,this);
  AbstractScrollArea::AbstractScrollArea
            (&this->super_AbstractScrollArea,(AbstractScrollAreaPrivate *)this_00,parent);
  *(undefined ***)&this->super_AbstractScrollArea = &PTR_metaObject_001bba00;
  *(undefined ***)&(this->super_AbstractScrollArea).field_0x10 = &PTR__ScrollArea_001bbbc8;
  QWidget::setBackgroundRole((ColorRole)((this->super_AbstractScrollArea).d.d)->viewport);
  return;
}

Assistant:

ScrollArea::ScrollArea( QWidget * parent )
	:	AbstractScrollArea( new ScrollAreaPrivate( this ), parent )
{
	ScrollAreaPrivate * d = d_func();
	d->viewport->setBackgroundRole( QPalette::NoRole );
}